

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_rtext.c
# Opt level: O2

void rtext_key(_rtext *x,int keynum,t_symbol *keysym)

{
  undefined1 *puVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  char *pcVar7;
  long lVar8;
  size_t sVar9;
  size_t oldsize;
  uint32_t ch;
  size_t __n;
  int h;
  int w;
  int indx;
  
  w = 0;
  h = 0;
  if (keynum == 0) {
    pcVar7 = keysym->s_name;
    iVar5 = strcmp(pcVar7,"Home");
    if (iVar5 == 0) {
      iVar5 = x->x_selstart;
      x->x_selstart = 0;
      if (x->x_selend == iVar5) {
        x->x_selend = 0;
      }
      goto LAB_0014ebac;
    }
    iVar5 = strcmp(pcVar7,"End");
    if (iVar5 == 0) {
      iVar5 = x->x_bufsize;
      if (x->x_selend == x->x_selstart) {
        x->x_selstart = iVar5;
      }
    }
    else {
      iVar5 = strcmp(pcVar7,"Right");
      if (iVar5 == 0) {
        iVar5 = x->x_selend;
        if ((iVar5 != x->x_selstart) || (x->x_bufsize <= iVar5)) {
          x->x_selstart = iVar5;
          goto LAB_0014ebac;
        }
        u8_inc(x->x_buf,&x->x_selstart);
      }
      else {
        iVar5 = strcmp(pcVar7,"Left");
        if (iVar5 != 0) {
          if (((*pcVar7 == 'U') && (pcVar7[1] == 'p')) && (pcVar7[2] == '\0')) {
            if (x->x_selstart == 0) goto LAB_0014ec3f;
            pcVar7 = x->x_buf;
            do {
              u8_dec(pcVar7,&x->x_selstart);
LAB_0014ec3f:
              iVar5 = x->x_selstart;
            } while ((0 < (long)iVar5) && (pcVar7 = x->x_buf, pcVar7[iVar5] != '\n'));
            x->x_selend = iVar5;
          }
          else {
            iVar5 = strcmp(pcVar7,"Down");
            if (iVar5 == 0) {
              do {
                iVar5 = x->x_selend;
                if (x->x_bufsize <= iVar5) goto LAB_0014ea03;
                cVar2 = x->x_buf[iVar5];
                u8_inc(x->x_buf,&x->x_selend);
              } while (cVar2 != '\n');
              iVar5 = x->x_selend;
LAB_0014ea03:
              x->x_selstart = iVar5;
            }
          }
          goto LAB_0014ebac;
        }
        iVar5 = x->x_selstart;
        if (iVar5 < 1 || x->x_selend != iVar5) goto LAB_0014ec25;
        u8_dec(x->x_buf,&x->x_selstart);
      }
      iVar5 = x->x_selstart;
    }
LAB_0014ec25:
    x->x_selend = iVar5;
    goto LAB_0014ebac;
  }
  if (keynum == 10) {
    if ((~x->x_text->field_0x2e & 3) == 0) {
      gatom_key(x->x_text,keysym,10.0);
      return;
    }
    ch = 10;
  }
  else {
    ch = 10;
    if (keynum != 0xd) {
      ch = keynum;
    }
    if (keynum == 0x7f) {
      if ((x->x_selend < x->x_bufsize) && (x->x_selstart == x->x_selend)) {
        u8_inc(x->x_buf,&x->x_selend);
      }
    }
    else if (((keynum == 8) && (x->x_selstart != 0)) && (x->x_selstart == x->x_selend)) {
      u8_dec(x->x_buf,&x->x_selstart);
    }
  }
  iVar5 = x->x_selend;
  lVar6 = (long)iVar5;
  iVar3 = x->x_selstart;
  lVar8 = (long)iVar3;
  while( true ) {
    iVar4 = x->x_bufsize;
    if (iVar4 <= lVar6) break;
    x->x_buf[lVar8] = x->x_buf[lVar6];
    lVar6 = lVar6 + 1;
    lVar8 = lVar8 + 1;
  }
  iVar5 = iVar4 - (iVar5 - iVar3);
  oldsize = (size_t)iVar5;
  sVar9 = oldsize + 1;
  pcVar7 = (char *)resizebytes(x->x_buf,(long)iVar4,sVar9);
  x->x_buf = pcVar7;
  pcVar7[oldsize] = '\0';
  x->x_bufsize = iVar5;
  if (ch == 10 || ch - 0x20 < 0x5f) {
    pcVar7 = (char *)resizebytes(x->x_buf,oldsize,(long)(iVar5 + 2));
    x->x_buf = pcVar7;
    for (lVar6 = (long)x->x_bufsize; x->x_selstart < lVar6; lVar6 = lVar6 + -1) {
      x->x_buf[lVar6] = x->x_buf[lVar6 + -1];
    }
    x->x_buf[x->x_selstart] = (char)ch;
    x->x_buf[sVar9] = '\0';
    x->x_bufsize = (int)sVar9;
    iVar5 = x->x_selstart + 1;
LAB_0014eb94:
    x->x_selstart = iVar5;
  }
  else {
    if (0x7f < (int)ch) {
      iVar5 = u8_wc_nbytes(ch);
      sVar9 = (size_t)x->x_bufsize;
      __n = (size_t)iVar5;
      lVar6 = sVar9 + __n;
      pcVar7 = (char *)resizebytes(x->x_buf,sVar9,sVar9 + __n + 1);
      x->x_buf = pcVar7;
      lVar8 = sVar9 + __n;
      while( true ) {
        lVar8 = lVar8 + -1;
        sVar9 = sVar9 - 1;
        pcVar7 = x->x_buf;
        if (lVar8 <= x->x_selstart) break;
        pcVar7[lVar8] = pcVar7[sVar9];
      }
      pcVar7[lVar6] = '\0';
      x->x_bufsize = (int)lVar6;
      strncpy(x->x_buf + x->x_selstart,keysym->s_name,__n);
      iVar5 = x->x_selstart + iVar5;
      goto LAB_0014eb94;
    }
    iVar5 = x->x_selstart;
  }
  x->x_selend = iVar5;
  puVar1 = &x->x_glist->gl_editor->field_0x88;
  *puVar1 = *puVar1 | 0x10;
LAB_0014ebac:
  rtext_senditup(x,2,&w,&h,&indx);
  return;
}

Assistant:

void rtext_key(t_rtext *x, int keynum, t_symbol *keysym)
{
    int w = 0, h = 0, indx, i, newsize, ndel;
    char *s1, *s2;
        /* CR to atom boxes sends message and resets */
    if (keynum == '\n' && x->x_text->te_type == T_ATOM)
    {
        gatom_key(x->x_text, keysym, keynum);
        return;
    }
    if (keynum)
    {
        int n = keynum;
        if (n == '\r') n = '\n';
        if (n == '\b')  /* backspace */
        {
                    /* LATER delete the box if all text is selected...
                    this causes reentrancy problems now. */
            /* if ((!x->x_selstart) && (x->x_selend == x->x_bufsize))
            {
                ....
            } */
            if (x->x_selstart && (x->x_selstart == x->x_selend))
                u8_dec(x->x_buf, &x->x_selstart);
        }
        else if (n == 127)      /* delete */
        {
            if (x->x_selend < x->x_bufsize && (x->x_selstart == x->x_selend))
                u8_inc(x->x_buf, &x->x_selend);
        }

        ndel = x->x_selend - x->x_selstart;
        for (i = x->x_selend; i < x->x_bufsize; i++)
            x->x_buf[i- ndel] = x->x_buf[i];
        newsize = x->x_bufsize - ndel;
            /* allocate extra space for hidden null terminator */
        x->x_buf = resizebytes(x->x_buf, x->x_bufsize, newsize+1);
        x->x_buf[newsize] = 0;
        x->x_bufsize = newsize;

/* at Guenter's suggestion, use 'n>31' to test whether a character might
be printable in whatever 8-bit character set we find ourselves. */

/*-- moo:
  ... but test with "<" rather than "!=" in order to accommodate unicode
  codepoints for n (which we get since Tk is sending the "%A" substitution
  for bind <Key>), effectively reducing the coverage of this clause to 7
  bits.  Case n>127 is covered by the next clause.
*/
        if (n == '\n' || (n > 31 && n < 127))
        {
            newsize = x->x_bufsize+1;
                /* allocate extra space for hidden null terminator */
            x->x_buf = resizebytes(x->x_buf, x->x_bufsize, newsize+1);
            for (i = x->x_bufsize; i > x->x_selstart; i--)
                x->x_buf[i] = x->x_buf[i-1];
            x->x_buf[x->x_selstart] = n;
            x->x_buf[newsize] = 0;
            x->x_bufsize = newsize;
            x->x_selstart = x->x_selstart + 1;
        }
        /*--moo: check for unicode codepoints beyond 7-bit ASCII --*/
        else if (n > 127)
        {
            int ch_nbytes = u8_wc_nbytes(n);
            newsize = x->x_bufsize + ch_nbytes;
                /* allocate extra space for hidden null terminator */
            x->x_buf = resizebytes(x->x_buf, x->x_bufsize, newsize+1);

            for (i = newsize-1; i > x->x_selstart; i--)
                x->x_buf[i] = x->x_buf[i-ch_nbytes];
            x->x_buf[newsize] = 0;
            x->x_bufsize = newsize;
            /*-- moo: assume canvas_key() has encoded keysym as UTF-8 */
            strncpy(x->x_buf+x->x_selstart, keysym->s_name, ch_nbytes);
            x->x_selstart = x->x_selstart + ch_nbytes;
        }
        x->x_selend = x->x_selstart;
        x->x_glist->gl_editor->e_textdirty = 1;
    }
    else if (!strcmp(keysym->s_name, "Home"))
    {
        if (x->x_selend == x->x_selstart)
        {
            x->x_selend = x->x_selstart = 0;
        }
        else
            x->x_selstart = 0;
    }
    else if (!strcmp(keysym->s_name, "End"))
    {
        if (x->x_selend == x->x_selstart)
        {
            x->x_selend = x->x_selstart = x->x_bufsize;
        }
        else
            x->x_selend = x->x_bufsize;
    }
    else if (!strcmp(keysym->s_name, "Right"))
    {
        if (x->x_selend == x->x_selstart && x->x_selstart < x->x_bufsize)
        {
            u8_inc(x->x_buf, &x->x_selstart);
            x->x_selend = x->x_selstart;
        }
        else
            x->x_selstart = x->x_selend;
    }
    else if (!strcmp(keysym->s_name, "Left"))
    {
        if (x->x_selend == x->x_selstart && x->x_selstart > 0)
        {
            u8_dec(x->x_buf, &x->x_selstart);
            x->x_selend = x->x_selstart;
        }
        else
            x->x_selend = x->x_selstart;
    }
        /* this should be improved...  life's too short */
    else if (!strcmp(keysym->s_name, "Up"))
    {
        if (x->x_selstart)
            u8_dec(x->x_buf, &x->x_selstart);
        while (x->x_selstart > 0 && x->x_buf[x->x_selstart] != '\n')
            u8_dec(x->x_buf, &x->x_selstart);
        x->x_selend = x->x_selstart;
    }
    else if (!strcmp(keysym->s_name, "Down"))
    {
        while (x->x_selend < x->x_bufsize &&
            x->x_buf[x->x_selend] != '\n')
            u8_inc(x->x_buf, &x->x_selend);
        if (x->x_selend < x->x_bufsize)
            u8_inc(x->x_buf, &x->x_selend);
        x->x_selstart = x->x_selend;
    }
    rtext_senditup(x, SEND_UPDATE, &w, &h, &indx);
}